

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

longdouble * get_big_float(FMFieldPtr field,void *data)

{
  undefined8 uVar1;
  longdouble *extraout_RAX;
  longdouble *extraout_RAX_00;
  longdouble *extraout_RAX_01;
  longdouble *plVar2;
  long in_RSI;
  longdouble *in_RDI;
  unsigned_long_long tmp_4;
  longlong tmp_3;
  longdouble tmp2_2;
  longdouble tmp_2;
  longdouble tmp2_1;
  double tmp_1;
  longdouble tmp2;
  float tmp;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  undefined8 local_78;
  undefined2 uStack_70;
  undefined6 uStack_6e;
  undefined2 in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa2;
  FMFieldPtr in_stack_ffffffffffffffa8;
  undefined4 local_2c [11];
  
  if (*(int *)((long)in_RDI + 0xc) == 3) {
    plVar2 = in_RDI;
    if (*(int *)((long)in_RDI + 8) == 4) {
      local_2c[0] = *(undefined4 *)(in_RSI + *(long *)in_RDI);
      if (*(char *)(in_RDI + 1) != '\0') {
        byte_swap((char *)local_2c,4);
        plVar2 = extraout_RAX;
      }
    }
    else if (*(int *)((long)in_RDI + 8) == 8) {
      float_conversion(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                       (FMfloat_format)in_stack_ffffffffffffff68,
                       (FMfloat_format)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      plVar2 = extraout_RAX_00;
    }
    else if ((longdouble *)(long)*(int *)((long)in_RDI + 8) == (longdouble *)0x10) {
      local_78 = *(undefined8 *)(in_RSI + *(long *)in_RDI);
      uVar1 = *(undefined8 *)(in_RSI + 8 + *(long *)in_RDI);
      uStack_70 = (undefined2)uVar1;
      uStack_6e = (undefined6)((ulong)uVar1 >> 0x10);
      if (*(char *)(in_RDI + 1) != '\0') {
        byte_swap((char *)&local_78,0x10);
        plVar2 = extraout_RAX_01;
      }
    }
    else {
      plVar2 = (longdouble *)(long)*(int *)((long)in_RDI + 8);
      if (get_big_float::get_double_warn == 0) {
        fprintf(_stderr,"Get Double failed!  Size problems.  File double size is %d.\n",
                (ulong)*(uint *)((long)in_RDI + 8));
        get_big_float::get_double_warn = get_big_float::get_double_warn + 1;
        plVar2 = (longdouble *)(ulong)(uint)get_big_float::get_double_warn;
      }
    }
  }
  else if (*(int *)((long)in_RDI + 0xc) == 1) {
    plVar2 = (longdouble *)
             get_big_int(in_stack_ffffffffffffffa8,
                         (void *)CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0));
  }
  else {
    if (*(int *)((long)in_RDI + 0xc) != 2) {
      fprintf(_stderr,"Get Double failed on invalid data type!\n");
      exit(1);
    }
    plVar2 = (longdouble *)
             get_big_unsigned(in_stack_ffffffffffffffa8,
                              (void *)CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))
    ;
  }
  return plVar2;
}

Assistant:

static MAX_FLOAT_TYPE
get_big_float(FMFieldPtr field, void *data)
{
    if (field->data_type == float_type) {
	if (field->size == sizeof(float)) {
	    float tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset), sizeof(float));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(float));
	    tmp2 = tmp;
	    return tmp2;
	} else if (field->size == sizeof(double)) {
	    double tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset), sizeof(double));
	    float_conversion((unsigned char *)&tmp, sizeof(double), 
			     (FMfloat_format)field->src_float_format,
			     (FMfloat_format)field->target_float_format);
	    tmp2 = tmp;
	    return tmp2;
#if SIZEOF_LONG_DOUBLE != 0
	} else if (field->size == sizeof(long double)) {
	    long double tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset),
		   sizeof(long double));
	    if (field->byte_swap)
		byte_swap((char *) &tmp,
			  (int)sizeof(long double));
	    tmp2 = tmp;
	    return tmp2;
#endif
	} else {
	    static int get_double_warn = 0;
	    if (!get_double_warn) {
		fprintf(stderr, "Get Double failed!  Size problems.  File double size is %d.\n", field->size);
		get_double_warn++;
	    }
	    return 0.0;
	}
    } else if (field->data_type == integer_type) {
	MAX_INTEGER_TYPE tmp = get_big_int(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	/* 
	 * A concession to inter-compiler interoperability...  We
	 * shouldn't need the (double)(long) casts here.  If we don't
	 * use them, AND we're on a machine which doesn't support "long 
	 * long" and "long double" in native code, gcc generates calls 
	 * to libgcc and the resulting library can't be linked with
	 * anything but GCC.  This can be a problem for installed
	 * libraries.  Using the casts avoids that particular problem,
	 * at a cost of data loss in the case of someone converting a
	 * "long long" that doesn't fit in a long to a floating point
	 * value. 
	 */
	return (MAX_FLOAT_TYPE) (double) (long) tmp;
#else
	return (MAX_FLOAT_TYPE) tmp;
#endif
    } else if (field->data_type == unsigned_type) {
	MAX_UNSIGNED_TYPE tmp = get_big_unsigned(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_FLOAT_TYPE) (double) (long) tmp;
#else
	return (MAX_FLOAT_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get Double failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}